

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O2

PAL_ERROR CorUnix::InternalCreateEvent
                    (CPalThread *pthr,LPSECURITY_ATTRIBUTES lpEventAttributes,BOOL bManualReset,
                    BOOL bInitialState,LPCWSTR lpName,HANDLE *phEvent)

{
  uint uVar1;
  undefined4 *puVar2;
  LPSECURITY_ATTRIBUTES p_Var3;
  undefined1 local_68 [8];
  CObjectAttributes oa;
  IPalObject *pobjRegisteredEvent;
  ISynchStateController *pssc;
  LPSECURITY_ATTRIBUTES local_38;
  IPalObject *pobjEvent;
  
  pssc._4_4_ = bInitialState;
  CObjectAttributes::CObjectAttributes((CObjectAttributes *)local_68,lpName,lpEventAttributes);
  local_38 = (LPSECURITY_ATTRIBUTES)0x0;
  oa.pSecurityAttributes = (LPSECURITY_ATTRIBUTES)0x0;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalCreateEvent",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/event.cpp"
            ,0xdd);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (phEvent == (HANDLE *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalCreateEvent",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/event.cpp"
            ,0xde);
    fprintf(_stderr,"Expression: NULL != phEvent\n");
  }
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_00135e6a;
  if (lpName == (LPCWSTR)0x0) {
    if (bManualReset == 0) {
      puVar2 = &otAutoResetEvent;
    }
    else {
      puVar2 = &otManualResetEvent;
    }
    uVar1 = (**(code **)*g_pObjectManager)(g_pObjectManager,pthr,puVar2,local_68,&local_38);
    p_Var3 = local_38;
    if (uVar1 == 0) {
      if (pssc._4_4_ == 0) {
LAB_00135e2e:
        uVar1 = (**(code **)(*g_pObjectManager + 8))
                          (g_pObjectManager,pthr,local_38,&aotEvent,0x1f0003,phEvent,
                           &oa.pSecurityAttributes);
        local_38 = (LPSECURITY_ATTRIBUTES)0x0;
        p_Var3 = oa.pSecurityAttributes;
      }
      else {
        uVar1 = (**(code **)(*(long *)local_38 + 0x28))(local_38,pthr,&pobjRegisteredEvent);
        if (uVar1 == 0) {
          uVar1 = (*pobjRegisteredEvent->_vptr_IPalObject[1])(pobjRegisteredEvent,1);
          (*pobjRegisteredEvent->_vptr_IPalObject[6])();
          if (uVar1 == 0) goto LAB_00135e2e;
        }
        fprintf(_stderr,"] %s %s:%d","InternalCreateEvent",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/event.cpp"
                ,0x10e);
        fprintf(_stderr,"Unable to set new event state (%d)\n",(ulong)uVar1);
        p_Var3 = local_38;
      }
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","InternalCreateEvent",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/event.cpp"
            ,0xec);
    fprintf(_stderr,"lpName: Cross-process named objects are not supported in PAL");
    uVar1 = 0x32;
    p_Var3 = local_38;
  }
  if (p_Var3 != (LPSECURITY_ATTRIBUTES)0x0) {
    (**(code **)(*(long *)p_Var3 + 0x40))(p_Var3,pthr);
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return uVar1;
  }
LAB_00135e6a:
  abort();
}

Assistant:

PAL_ERROR
CorUnix::InternalCreateEvent(
    CPalThread *pthr,
    LPSECURITY_ATTRIBUTES lpEventAttributes,
    BOOL bManualReset,
    BOOL bInitialState,
    LPCWSTR lpName,
    HANDLE *phEvent
    )
{
    CObjectAttributes oa(lpName, lpEventAttributes);
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjEvent = NULL;
    IPalObject *pobjRegisteredEvent = NULL;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != phEvent);

    ENTRY("InternalCreateEvent(pthr=%p, lpEventAttributes=%p, bManualReset=%i, "
        "bInitialState=%i, lpName=%p, phEvent=%p)\n",
        pthr,
        lpEventAttributes,
        bManualReset,
        bInitialState,
        lpName,
        phEvent
        );

    if (lpName != nullptr)
    {
        ASSERT("lpName: Cross-process named objects are not supported in PAL");
        palError = ERROR_NOT_SUPPORTED;
        goto InternalCreateEventExit;
    }

    palError = g_pObjectManager->AllocateObject(
        pthr,
        bManualReset ? &otManualResetEvent : &otAutoResetEvent,
        &oa,
        &pobjEvent
        );

    if (NO_ERROR != palError)
    {
        goto InternalCreateEventExit;
    }

    if (bInitialState)
    {
        ISynchStateController *pssc;

        palError = pobjEvent->GetSynchStateController(
            pthr,
            &pssc
            );

        if (NO_ERROR == palError)
        {
            palError = pssc->SetSignalCount(1);
            pssc->ReleaseController();
        }

        if (NO_ERROR != palError)
        {
            ASSERT("Unable to set new event state (%d)\n", palError);
            goto InternalCreateEventExit;
        }
    }

    palError = g_pObjectManager->RegisterObject(
        pthr,
        pobjEvent,
        &aotEvent, 
        EVENT_ALL_ACCESS, // Currently ignored (no Win32 security)
        phEvent,
        &pobjRegisteredEvent
        );

    //
    // pobjEvent is invalidated by the call to RegisterObject, so NULL it
    // out here to ensure that we don't try to release a reference on
    // it down the line.
    //
    
    pobjEvent = NULL;

InternalCreateEventExit:

    if (NULL != pobjEvent)
    {
        pobjEvent->ReleaseReference(pthr);
    }

    if (NULL != pobjRegisteredEvent)
    {
        pobjRegisteredEvent->ReleaseReference(pthr);
    }

    LOGEXIT("InternalCreateEvent returns %i\n", palError);

    return palError;
}